

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O2

bool __thiscall SearchBase::isSubtoken(SearchBase *this,string_view strv,string_view subtoken)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  string_view suffix;
  string_view suffix_00;
  undefined1 local_38 [8];
  string_view strv_local;
  
  strv_local._M_len = (size_t)strv._M_str;
  local_38 = (undefined1  [8])strv._M_len;
  suffix._M_str = "<>";
  suffix._M_len = 2;
  removeSuffix(this,(string_view *)local_38,suffix);
  suffix_00._M_str = "&lt;&gt;";
  suffix_00._M_len = 8;
  removeSuffix(this,(string_view *)local_38,suffix_00);
  __x._M_str = (char *)strv_local._M_len;
  __x._M_len = (size_t)local_38;
  bVar1 = std::operator==(__x,subtoken);
  return bVar1;
}

Assistant:

bool isSubtoken(std::string_view strv, std::string_view subtoken) const {
		removeSuffix(strv, "<>");
		removeSuffix(strv, "&lt;&gt;");

		return strv == subtoken;
	}